

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::Begin(DeviceContextGLImpl *this,Uint32 ImmediateContextId)

{
  string msg;
  
  FormatString<char[42]>(&msg,(char (*) [42])"OpenGL does not support deferred contexts");
  DebugAssertionFailed
            (msg._M_dataplus._M_p,"Begin",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x54);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void DeviceContextGLImpl::Begin(Uint32 ImmediateContextId)
{
    UNEXPECTED("OpenGL does not support deferred contexts");
    (void)(ImmediateContextId);
}